

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

char * __thiscall
FailableMemoryAllocator::alloc_memory
          (FailableMemoryAllocator *this,size_t size,char *file,size_t line)

{
  FailableMemoryAllocator *this_00;
  bool bVar1;
  char *pcVar2;
  LocationToFailAllocNode **ppLVar3;
  size_t sVar4;
  char *extraout_RDX;
  FailableMemoryAllocator *pFVar5;
  FailableMemoryAllocator *this_01;
  
  this->currentAllocNumber_ = this->currentAllocNumber_ + 1;
  ppLVar3 = &this->head_;
  sVar4 = line;
  pcVar2 = file;
  pFVar5 = (FailableMemoryAllocator *)0x0;
  this_01 = this;
  while( true ) {
    this_00 = (FailableMemoryAllocator *)*ppLVar3;
    if (this_00 == (FailableMemoryAllocator *)0x0) {
      pcVar2 = TestMemoryAllocator::alloc_memory
                         (&this_01->super_TestMemoryAllocator,size,pcVar2,sVar4);
      return pcVar2;
    }
    sVar4 = line;
    this_01 = this_00;
    bVar1 = LocationToFailAllocNode::shouldFail
                      ((LocationToFailAllocNode *)this_00,this->currentAllocNumber_,file,line);
    if (bVar1) break;
    ppLVar3 = (LocationToFailAllocNode **)&(this_00->super_TestMemoryAllocator).free_name_;
    pcVar2 = extraout_RDX;
    pFVar5 = this_00;
  }
  ppLVar3 = (LocationToFailAllocNode **)&(pFVar5->super_TestMemoryAllocator).free_name_;
  if (pFVar5 == (FailableMemoryAllocator *)0x0) {
    ppLVar3 = &this->head_;
  }
  *ppLVar3 = (LocationToFailAllocNode *)(this_00->super_TestMemoryAllocator).free_name_;
  (*(this->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[3])
            (this,this_00,size,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O2/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
             ,0x166);
  return (char *)0x0;
}

Assistant:

char* FailableMemoryAllocator::alloc_memory(size_t size, const char* file, size_t line)
{
    currentAllocNumber_++;
    LocationToFailAllocNode* current = head_;
    LocationToFailAllocNode* previous = NULLPTR;

    while (current) {
      if (current->shouldFail(currentAllocNumber_, file, line)) {
        if (previous) previous->next_ = current->next_;
        else head_ = current->next_;

        free_memory((char*) current, size, __FILE__, __LINE__);
        return NULLPTR;
      }
      previous = current;
      current = current->next_;
    }
    return TestMemoryAllocator::alloc_memory(size, file, line);
}